

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CFG::findAtoBCproductions
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CFG *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *B,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *C)

{
  bool bVar1;
  bool bVar2;
  reference ppPVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *psVar7;
  byte local_142;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  byte local_101;
  string local_100;
  byte local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  byte local_b9;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_70;
  Production *local_50;
  Production *production;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *C_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *B_local;
  CFG *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *A;
  
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
  production = (Production *)
               std::vector<Production_*,_std::allocator<Production_*>_>::end(&this->productionsP);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                     *)&production), bVar1) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppPVar3;
    pvVar4 = Production::getToP_abi_cxx11_(local_50);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar4);
    if (sVar5 == 2) {
      pvVar4 = Production::getToP_abi_cxx11_(local_50);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar4,0);
      local_b9 = 0;
      local_d9 = 0;
      local_101 = 0;
      bVar1 = false;
      std::__cxx11::string::string((string *)&local_70,(string *)pvVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_98,B);
      bVar2 = inVector(&local_70,&local_98);
      local_142 = 0;
      if (bVar2) {
        pvVar4 = Production::getToP_abi_cxx11_(local_50);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar4,1);
        std::__cxx11::string::string((string *)&local_b8,(string *)pvVar6);
        local_b9 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_d8,C);
        local_d9 = 1;
        bVar2 = inVector(&local_b8,&local_d8);
        local_142 = 0;
        if (bVar2) {
          psVar7 = Production::getFromP_abi_cxx11_(local_50);
          std::__cxx11::string::string((string *)&local_100,(string *)psVar7);
          local_101 = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_120,__return_storage_ptr__);
          bVar1 = true;
          bVar2 = inVector(&local_100,&local_120);
          local_142 = bVar2 ^ 0xff;
        }
      }
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_120);
      }
      if ((local_101 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_100);
      }
      if ((local_d9 & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8);
      }
      if ((local_b9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      if ((local_142 & 1) != 0) {
        psVar7 = Production::getFromP_abi_cxx11_(local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,psVar7);
      }
    }
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CFG::findAtoBCproductions(std::vector<std::string> &B, std::vector<std::string> &C) {
    std::vector<std::string> A = {};
    for (Production *production: productionsP) {
        if (production->getToP().size() == 2) { // Check whether it's not a terminal
            if (inVector(production->getToP()[0], B) &&
                inVector(production->getToP()[1], C) &&
                !inVector(production->getFromP(), A)) {
                A.push_back(production->getFromP());
            }
        }
    }

    return A;
}